

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

void __thiscall LinkedObjectFile::find_functions(LinkedObjectFile *this)

{
  ulong uVar1;
  uint32_t *puVar2;
  pointer puVar3;
  pointer pvVar4;
  pointer pvVar5;
  Function *pFVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined8 in_RAX;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  Function *__a;
  ulong uVar14;
  Function *__b;
  int function_tag_loc;
  int function_end;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this->segments == 1) {
    puVar3 = (this->offset_of_data_zone_by_seg).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->offset_of_data_zone_by_seg).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar3) {
      uVar11 = 0;
      uVar14 = 0;
LAB_0012f9b1:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
                 uVar11);
    }
    if (*puVar3 != 0) {
      __assert_fail("offset_of_data_zone_by_seg.at(0) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x171,"void LinkedObjectFile::find_functions()");
    }
  }
  else if (0 < this->segments) {
    uVar12 = 0;
    do {
      puVar3 = (this->offset_of_data_zone_by_seg).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = (long)(this->offset_of_data_zone_by_seg).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      uVar14 = uVar12;
      if (uVar11 <= uVar12) goto LAB_0012f9b1;
      uVar8 = puVar3[uVar12];
      local_38 = CONCAT44(uVar8,(uint)local_38);
      while (0 < (int)uVar8) {
        local_38 = CONCAT44(local_38._4_4_,uVar8);
        bVar13 = false;
        do {
          lVar10 = (long)(int)(uint)local_38;
          uVar1 = lVar10 - 1;
          local_38 = CONCAT44(local_38._4_4_,(int)uVar1);
          if (lVar10 < 1) break;
          pvVar4 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                   -0x5555555555555555;
          uVar14 = uVar12;
          if (uVar11 < uVar12 || uVar11 - uVar12 == 0) goto LAB_0012f9b1;
          lVar10 = *(long *)&pvVar4[uVar12].
                             super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                             super__Vector_impl_data;
          uVar11 = ((long)*(pointer *)
                           ((long)&pvVar4[uVar12].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar10 >> 4) *
                   -0x5555555555555555;
          uVar14 = uVar1;
          if (uVar11 < uVar1 || uVar11 - uVar1 == 0) goto LAB_0012f9b1;
          if ((*(int *)(lVar10 + uVar1 * 0x30) == 7) &&
             (iVar9 = std::__cxx11::string::compare((char *)(lVar10 + uVar1 * 0x30 + 0x10)),
             iVar9 == 0)) {
            bVar13 = true;
            bVar7 = false;
          }
          else {
            bVar7 = true;
          }
        } while (bVar7);
        if (!bVar13) {
          __assert_fail("found_function_tag_loc",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x187,"void LinkedObjectFile::find_functions()");
        }
        puVar2 = &(this->stats).function_count;
        *puVar2 = *puVar2 + 1;
        pvVar5 = (this->functions_by_seg).
                 super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = ((long)(this->functions_by_seg).
                        super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                 -0x5555555555555555;
        uVar14 = uVar12;
        if (uVar11 < uVar12 || uVar11 - uVar12 == 0) goto LAB_0012f9b1;
        std::vector<Function,std::allocator<Function>>::emplace_back<int&,int&>
                  ((vector<Function,std::allocator<Function>> *)(pvVar5 + uVar12),(int *)&local_38,
                   (int *)((long)&local_38 + 4));
        local_38 = CONCAT44((uint)local_38,(uint)local_38);
        uVar8 = (uint)local_38;
      }
      pvVar5 = (this->functions_by_seg).
               super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(this->functions_by_seg).
                      super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x5555555555555555;
      uVar14 = uVar12;
      if (uVar11 < uVar12 || uVar11 - uVar12 == 0) goto LAB_0012f9b1;
      __a = pvVar5[uVar12].super__Vector_base<Function,_std::allocator<Function>_>._M_impl.
            super__Vector_impl_data._M_start;
      pFVar6 = *(pointer *)
                ((long)&pvVar5[uVar12].super__Vector_base<Function,_std::allocator<Function>_>.
                        _M_impl.super__Vector_impl_data + 8);
      __b = pFVar6 + -1;
      if (__a < __b && __a != pFVar6) {
        do {
          std::swap<Function>(__a,__b);
          __a = __a + 1;
          __b = __b + -1;
        } while (__a < __b);
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->segments);
  }
  return;
}

Assistant:

void LinkedObjectFile::find_functions() {
  if (segments == 1) {
    // it's a v2 file, shouldn't have any functions
    assert(offset_of_data_zone_by_seg.at(0) == 0);
  } else {
    // we assume functions don't have any data in between them, so we use the "function" type tag to
    // mark the end of the previous function and the start of the next.  This means that some
    // functions will have a few 0x0 words after then for padding (GOAL functions are aligned), but
    // this is something that the disassembler should handle.
    for (int seg = 0; seg < segments; seg++) {
      // start at the end and work backward...
      int function_end = offset_of_data_zone_by_seg.at(seg);
      while (function_end > 0) {
        // back up until we find function type tag
        int function_tag_loc = function_end;
        bool found_function_tag_loc = false;
        for (; function_tag_loc-- > 0;) {
          auto& word = words_by_seg.at(seg).at(function_tag_loc);
          if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
            found_function_tag_loc = true;
            break;
          }
        }

        // mark this as a function, and try again from the current function start
        assert(found_function_tag_loc);
        stats.function_count++;
        functions_by_seg.at(seg).emplace_back(function_tag_loc, function_end);
        function_end = function_tag_loc;
      }

      std::reverse(functions_by_seg.at(seg).begin(), functions_by_seg.at(seg).end());
    }
  }
}